

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR mergeforward(LispPTR base)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  arrayblock *bnbase;
  arrayblock *bbase;
  LispPTR nbinuse;
  LispPTR nbase;
  LispPTR base_local;
  
  if (*ArrayMerging_word == 0) {
    nbase = 0;
  }
  else if (base == 0) {
    nbase = 0;
  }
  else {
    LVar2 = checkarrayblock(base,1,1);
    if (LVar2 == 0) {
      pLVar4 = NativeAligned4FromLAddr(base);
      LVar2 = base + (uint)(ushort)*pLVar4 * 2;
      if ((LVar2 == *ArrayFrLst_word) || (LVar2 == *ArrayFrLst2_word)) {
        nbase = 0;
      }
      else {
        pLVar4 = NativeAligned4FromLAddr(LVar2);
        uVar1 = *(ushort *)((long)pLVar4 + 2) & 1;
        LVar3 = checkarrayblock(LVar2,(uint)((uVar1 != 0 ^ 0xffU) & 1),0);
        if (LVar3 == 0) {
          if (uVar1 == 0) {
            deleteblock(LVar2);
            deleteblock(base);
            nbase = arrayblockmerger(base,LVar2);
          }
          else {
            nbase = 0;
          }
        }
        else {
          nbase = 0;
        }
      }
    }
    else {
      nbase = 0;
    }
  }
  return nbase;
}

Assistant:

LispPTR mergeforward(LispPTR base) {
  LispPTR nbase, nbinuse;
  struct arrayblock *bbase, *bnbase;
  if (*ArrayMerging_word == NIL) return NIL;
  if (base == NIL) return NIL;
  if (checkarrayblock(base, T, T)) return NIL;

  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  nbase = base + 2 * (bbase->arlen);
  if (nbase == *ArrayFrLst_word || nbase == *ArrayFrLst2_word) return NIL;

  bnbase = (struct arrayblock *)NativeAligned4FromLAddr(nbase);
  nbinuse = bnbase->inuse;
  if (checkarrayblock(nbase, !nbinuse, NIL)) return NIL;
  if (nbinuse) return (NIL);
  deleteblock(nbase);
  deleteblock(base);
  return (arrayblockmerger(base, nbase));
}